

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

int __thiscall
HullLibrary::calchullgen(HullLibrary *this,cbtVector3 *verts,int verts_count,int vlimit)

{
  int *piVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  HullLibrary *pHVar17;
  cbtHullTriangle *pcVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  HullLibrary *pHVar24;
  int iVar25;
  int b;
  ulong uVar26;
  cbtVector3 *v1;
  cbtVector3 *pcVar27;
  float fVar28;
  undefined1 auVar29 [64];
  undefined1 auVar32 [56];
  undefined1 auVar30 [64];
  undefined1 extraout_var [60];
  undefined1 auVar31 [64];
  undefined1 auVar33 [64];
  undefined1 auVar35 [56];
  undefined1 auVar34 [64];
  cbtInt4 cVar36;
  cbtVector3 cVar37;
  cbtAlignedObjectArray<int> allow;
  cbtAlignedObjectArray<int> isextreme;
  cbtVector3 n;
  cbtScalar local_dc;
  cbtScalar local_d8;
  cbtScalar local_d0;
  cbtScalar local_c0;
  cbtScalar local_b8;
  cbtScalar local_b0;
  cbtAlignedObjectArray<int> local_a8;
  cbtAlignedObjectArray<int> local_88;
  HullLibrary *local_68;
  cbtVector3 local_60;
  ulong local_50;
  ulong local_48;
  float local_3c;
  float local_38;
  float local_34;
  
  iVar16 = 0;
  if (3 < verts_count) {
    local_c0 = verts->m_floats[0];
    local_dc = verts->m_floats[1];
    local_d8 = verts->m_floats[2];
    local_88.m_ownsMemory = true;
    local_88.m_data = (int *)0x0;
    local_88.m_size = 0;
    local_88.m_capacity = 0;
    local_68 = this;
    pHVar17 = (HullLibrary *)cbtAlignedAllocInternal((ulong)(uint)verts_count * 4,0x10);
    if (0 < (long)local_88.m_size) {
      lVar20 = 0;
      do {
        *(int *)(pHVar17 + lVar20 * 4) = local_88.m_data[lVar20];
        lVar20 = lVar20 + 1;
      } while (local_88.m_size != lVar20);
    }
    if ((local_88.m_data != (int *)0x0) && (local_88.m_ownsMemory == true)) {
      cbtAlignedFreeInternal(local_88.m_data);
    }
    local_88.m_ownsMemory = true;
    local_a8.m_ownsMemory = true;
    local_a8.m_data = (int *)0x0;
    local_a8.m_size = 0;
    local_a8.m_capacity = 0;
    local_88.m_data = (int *)pHVar17;
    local_88.m_capacity = verts_count;
    pHVar17 = (HullLibrary *)cbtAlignedAllocInternal((ulong)(uint)verts_count << 2,0x10);
    if (0 < (long)local_a8.m_size) {
      lVar20 = 0;
      do {
        *(undefined4 *)(pHVar17 + lVar20 * 4) = *(undefined4 *)((long)local_a8.m_data + lVar20 * 4);
        lVar20 = lVar20 + 1;
      } while (local_a8.m_size != lVar20);
    }
    pHVar24 = (HullLibrary *)local_a8.m_data;
    if (((HullLibrary *)local_a8.m_data != (HullLibrary *)0x0) && (local_a8.m_ownsMemory == true)) {
      cbtAlignedFreeInternal(local_a8.m_data);
      pHVar24 = (HullLibrary *)local_a8.m_data;
    }
    local_a8.m_ownsMemory = true;
    uVar26 = 1;
    if (1 < verts_count) {
      uVar26 = (ulong)(uint)verts_count;
    }
    uVar22 = 0;
    local_a8.m_data = (int *)pHVar17;
    local_50 = (ulong)(uint)vlimit;
    local_a8.m_capacity = verts_count;
    local_d0 = local_dc;
    local_b8 = local_c0;
    local_b0 = local_d8;
    do {
      if (local_a8.m_size == local_a8.m_capacity) {
        iVar16 = local_a8.m_size * 2;
        if (local_a8.m_size == 0) {
          iVar16 = 1;
        }
        if (local_a8.m_capacity < iVar16) {
          if (iVar16 == 0) {
            pHVar17 = (HullLibrary *)0x0;
          }
          else {
            pHVar17 = (HullLibrary *)cbtAlignedAllocInternal((long)iVar16 << 2,0x10);
          }
          if (0 < (long)local_a8.m_size) {
            lVar20 = 0;
            do {
              *(undefined4 *)(pHVar17 + lVar20 * 4) =
                   *(undefined4 *)((long)local_a8.m_data + lVar20 * 4);
              lVar20 = lVar20 + 1;
            } while (local_a8.m_size != lVar20);
          }
          if (((HullLibrary *)local_a8.m_data != (HullLibrary *)0x0) &&
             (local_a8.m_ownsMemory == true)) {
            cbtAlignedFreeInternal(local_a8.m_data);
          }
          local_a8.m_ownsMemory = true;
          pHVar24 = (HullLibrary *)local_a8.m_data;
          local_a8.m_data = (int *)pHVar17;
          local_a8.m_capacity = iVar16;
        }
      }
      *(undefined4 *)((long)local_a8.m_data + (long)local_a8.m_size * 4) = 1;
      local_a8.m_size = local_a8.m_size + 1;
      if (local_88.m_size == local_88.m_capacity) {
        iVar16 = local_88.m_size * 2;
        if (local_88.m_size == 0) {
          iVar16 = 1;
        }
        if (local_88.m_capacity < iVar16) {
          if (iVar16 == 0) {
            pHVar17 = (HullLibrary *)0x0;
          }
          else {
            pHVar17 = (HullLibrary *)cbtAlignedAllocInternal((long)iVar16 << 2,0x10);
          }
          if (0 < (long)local_88.m_size) {
            lVar20 = 0;
            do {
              *(undefined4 *)(pHVar17 + lVar20 * 4) =
                   *(undefined4 *)((long)local_88.m_data + lVar20 * 4);
              lVar20 = lVar20 + 1;
            } while (local_88.m_size != lVar20);
          }
          if (((HullLibrary *)local_88.m_data != (HullLibrary *)0x0) &&
             (local_88.m_ownsMemory == true)) {
            cbtAlignedFreeInternal(local_88.m_data);
          }
          local_88.m_ownsMemory = true;
          pHVar24 = (HullLibrary *)local_88.m_data;
          local_88.m_data = (int *)pHVar17;
          local_88.m_capacity = iVar16;
        }
      }
      *(undefined4 *)((long)local_88.m_data + (long)local_88.m_size * 4) = 0;
      local_88.m_size = local_88.m_size + 1;
      auVar2 = vminss_avx(ZEXT416((uint)verts[uVar22].m_floats[0]),ZEXT416((uint)local_c0));
      local_c0 = auVar2._0_4_;
      auVar2 = vminss_avx(ZEXT416((uint)verts[uVar22].m_floats[1]),ZEXT416((uint)local_d0));
      local_d0 = auVar2._0_4_;
      auVar2 = vminss_avx(ZEXT416((uint)verts[uVar22].m_floats[2]),ZEXT416((uint)local_d8));
      local_d8 = auVar2._0_4_;
      auVar2 = vmaxss_avx(ZEXT416((uint)verts[uVar22].m_floats[0]),ZEXT416((uint)local_b8));
      local_b8 = auVar2._0_4_;
      auVar2 = vmaxss_avx(ZEXT416((uint)verts[uVar22].m_floats[1]),ZEXT416((uint)local_dc));
      local_dc = auVar2._0_4_;
      auVar2 = vmaxss_avx(ZEXT416((uint)verts[uVar22].m_floats[2]),ZEXT416((uint)local_b0));
      local_b0 = auVar2._0_4_;
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar26);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)((local_dc - local_d0) * (local_dc - local_d0))),
                             ZEXT416((uint)(local_b8 - local_c0)),
                             ZEXT416((uint)(local_b8 - local_c0)));
    auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)(local_b0 - local_d8)),
                             ZEXT416((uint)(local_b0 - local_d8)));
    if (auVar2._0_4_ < 0.0) {
      fVar28 = sqrtf(auVar2._0_4_);
    }
    else {
      auVar2 = vsqrtss_avx(auVar2,auVar2);
      fVar28 = auVar2._0_4_;
    }
    cVar36 = FindSimplex(pHVar24,verts,verts_count,&local_a8);
    pHVar17 = local_68;
    iVar16 = cVar36.x;
    if (iVar16 == -1) {
      iVar16 = 0;
    }
    else {
      lVar20 = (long)iVar16;
      lVar19 = cVar36._0_8_ >> 0x20;
      iVar15 = cVar36.z;
      lVar23 = (long)iVar15;
      local_38 = verts[lVar20].m_floats[1] + verts[lVar19].m_floats[1] + verts[lVar23].m_floats[1];
      auVar33 = ZEXT464((uint)local_38);
      lVar21 = cVar36._8_8_ >> 0x20;
      local_34 = verts[lVar20].m_floats[0] + verts[lVar19].m_floats[0] + verts[lVar23].m_floats[0] +
                 verts[lVar21].m_floats[0];
      local_38 = local_38 + verts[lVar21].m_floats[1];
      local_3c = verts[lVar20].m_floats[2] + verts[lVar19].m_floats[2] + verts[lVar23].m_floats[2] +
                 verts[lVar21].m_floats[2];
      auVar29 = ZEXT464((uint)local_3c);
      b = cVar36.w;
      iVar25 = cVar36.y;
      local_48 = (ulong)(vlimit - 4);
      pcVar18 = allocateTriangle(local_68,iVar15,b,iVar25);
      (pcVar18->n).x = 2;
      (pcVar18->n).y = 3;
      (pcVar18->n).z = 1;
      pcVar18 = allocateTriangle(pHVar17,b,iVar15,iVar16);
      (pcVar18->n).x = 3;
      (pcVar18->n).y = 2;
      (pcVar18->n).z = 0;
      pcVar18 = allocateTriangle(pHVar17,iVar16,iVar25,b);
      (pcVar18->n).x = 0;
      (pcVar18->n).y = 1;
      (pcVar18->n).z = 3;
      pcVar18 = allocateTriangle(pHVar17,iVar25,iVar16,iVar15);
      (pcVar18->n).x = 1;
      (pcVar18->n).y = 0;
      (pcVar18->n).z = 2;
      *(undefined4 *)((long)local_88.m_data + lVar21 * 4) = 1;
      *(undefined4 *)((long)local_88.m_data + lVar23 * 4) = 1;
      *(undefined4 *)((long)local_88.m_data + lVar19 * 4) = 1;
      *(undefined4 *)((long)local_88.m_data + lVar20 * 4) = 1;
      if (0 < *(int *)(pHVar17 + 4)) {
        lVar20 = 0;
        do {
          auVar35 = auVar33._8_56_;
          auVar32 = auVar29._8_56_;
          piVar1 = *(int **)(*(long *)(pHVar17 + 0x10) + lVar20 * 8);
          cVar37 = TriNormal(verts + *piVar1,verts + piVar1[1],verts + piVar1[2]);
          auVar33._0_8_ = cVar37.m_floats._8_8_;
          auVar33._8_56_ = auVar35;
          auVar29._0_8_ = cVar37.m_floats._0_8_;
          auVar29._8_56_ = auVar32;
          local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar29._0_16_,auVar33._0_16_);
          iVar15 = maxdirsterid<cbtVector3>(verts,verts_count,&local_60,&local_a8);
          piVar1[7] = iVar15;
          iVar16 = *piVar1;
          fVar6 = verts[iVar15].m_floats[0] - verts[iVar16].m_floats[0];
          auVar29 = ZEXT464((uint)fVar6);
          auVar2 = vfmadd231ss_fma(ZEXT416((uint)((verts[iVar15].m_floats[1] -
                                                  verts[iVar16].m_floats[1]) * local_60.m_floats[1])
                                          ),ZEXT416((uint)fVar6),ZEXT416((uint)local_60.m_floats[0])
                                  );
          auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)(verts[iVar15].m_floats[2] -
                                                        verts[iVar16].m_floats[2])),
                                   ZEXT416((uint)local_60.m_floats[2]));
          auVar33 = ZEXT1664(auVar2);
          piVar1[8] = auVar2._0_4_;
          lVar20 = lVar20 + 1;
        } while (lVar20 < *(int *)(pHVar17 + 4));
      }
      uVar26 = local_48 & 0xffffffff;
      if ((cbtScalar)local_50 == 0.0) {
        uVar26 = 0x3b9ac9fc;
      }
      if (0 < (int)uVar26) {
        fVar28 = fVar28 * 0.001;
        auVar34 = ZEXT464((uint)fVar28);
        fVar6 = local_34 * 0.25;
        fVar3 = local_38 * 0.25;
        fVar4 = local_3c * 0.25;
        local_50 = CONCAT44(local_50._4_4_,fVar28);
        fVar5 = fVar28 * fVar28 * 0.1;
        pHVar17 = local_68;
LAB_00914f84:
        auVar30 = ZEXT464((uint)(cbtScalar)local_50);
        pcVar18 = extrudable(pHVar17,(cbtScalar)local_50);
        if (pcVar18 != (cbtHullTriangle *)0x0) {
          iVar16 = pcVar18->vmax;
          *(undefined4 *)((long)local_88.m_data + (long)iVar16 * 4) = 1;
          lVar20 = (long)*(int *)(pHVar17 + 4);
          local_48 = uVar26;
          if (lVar20 != 0) {
            pcVar27 = verts + iVar16;
            do {
              auVar35 = auVar34._8_56_;
              auVar32 = auVar30._8_56_;
              piVar1 = *(int **)(*(long *)(pHVar17 + 0x10) + -8 + lVar20 * 8);
              if (piVar1 != (int *)0x0) {
                iVar15 = *piVar1;
                cVar37 = TriNormal(verts + iVar15,verts + piVar1[1],verts + piVar1[2]);
                auVar34._0_8_ = cVar37.m_floats._8_8_;
                auVar34._8_56_ = auVar35;
                auVar30._0_8_ = cVar37.m_floats._0_8_;
                auVar30._8_56_ = auVar32;
                auVar2 = vmovshdup_avx(auVar30._0_16_);
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ *
                                                       (pcVar27->m_floats[1] -
                                                       verts[iVar15].m_floats[1]))),auVar30._0_16_,
                                         ZEXT416((uint)(pcVar27->m_floats[0] -
                                                       verts[iVar15].m_floats[0])));
                auVar2 = vfmadd231ss_fma(auVar2,auVar34._0_16_,
                                         ZEXT416((uint)(pcVar27->m_floats[2] -
                                                       verts[iVar15].m_floats[2])));
                if (fVar28 * 0.01 < auVar2._0_4_) {
                  extrude(pHVar17,*(cbtHullTriangle **)(*(long *)(pHVar17 + 0x10) + -8 + lVar20 * 8)
                          ,iVar16);
                }
              }
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
          }
          iVar15 = *(int *)(pHVar17 + 4);
          pHVar24 = pHVar17;
joined_r0x0091506c:
          do {
            pHVar17 = pHVar24;
            if (iVar15 == 0) goto LAB_009151e2;
            auVar35 = auVar34._8_56_;
            auVar32 = auVar30._8_56_;
            lVar20 = (long)iVar15;
            iVar15 = iVar15 + -1;
            piVar1 = *(int **)(*(long *)(pHVar17 + 0x10) + -8 + lVar20 * 8);
            pHVar24 = local_68;
            if (piVar1 != (int *)0x0) {
              iVar25 = *piVar1;
              if (((iVar25 != iVar16) && (piVar1[1] != iVar16)) && (piVar1[2] != iVar16))
              goto LAB_009151e2;
              v1 = verts + piVar1[1];
              pcVar27 = verts + piVar1[2];
              cVar37 = TriNormal(verts + iVar25,v1,pcVar27);
              auVar34._0_8_ = cVar37.m_floats._8_8_;
              auVar34._8_56_ = auVar35;
              auVar30._0_8_ = cVar37.m_floats._0_8_;
              auVar30._8_56_ = auVar32;
              auVar2 = vmovshdup_avx(auVar30._0_16_);
              auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ *
                                                     (fVar3 - verts[iVar25].m_floats[1]))),
                                       auVar30._0_16_,
                                       ZEXT416((uint)(fVar6 - verts[iVar25].m_floats[0])));
              auVar2 = vfmadd231ss_fma(auVar2,auVar34._0_16_,
                                       ZEXT416((uint)(fVar4 - verts[iVar25].m_floats[2])));
              if (auVar2._0_4_ <= fVar28 * 0.01) {
                fVar7 = v1->m_floats[0] - verts[iVar25].m_floats[0];
                fVar8 = v1->m_floats[1] - verts[iVar25].m_floats[1];
                fVar9 = v1->m_floats[2] - verts[iVar25].m_floats[2];
                fVar10 = pcVar27->m_floats[0] - v1->m_floats[0];
                fVar11 = pcVar27->m_floats[1] - v1->m_floats[1];
                fVar12 = pcVar27->m_floats[2] - v1->m_floats[2];
                auVar2 = vfmsub231ss_fma(ZEXT416((uint)(fVar11 * fVar9)),ZEXT416((uint)fVar8),
                                         ZEXT416((uint)fVar12));
                auVar13 = vfmsub231ss_fma(ZEXT416((uint)(fVar12 * fVar7)),ZEXT416((uint)fVar10),
                                          ZEXT416((uint)fVar9));
                auVar14 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416((uint)fVar7),
                                          ZEXT416((uint)fVar11));
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar13._0_4_)),auVar2,
                                         auVar2);
                auVar2 = vfmadd231ss_fma(auVar2,auVar14,auVar14);
                if (auVar2._0_4_ < 0.0) {
                  auVar30._0_4_ = sqrtf(auVar2._0_4_);
                  auVar30._4_60_ = extraout_var;
                }
                else {
                  auVar2 = vsqrtss_avx(auVar2,auVar2);
                  auVar30 = ZEXT1664(auVar2);
                }
                auVar34 = ZEXT464((uint)fVar5);
                pHVar24 = local_68;
                if (fVar5 <= auVar30._0_4_) goto joined_r0x0091506c;
              }
              pHVar17 = local_68;
              extrude(local_68,*(cbtHullTriangle **)
                                (*(long *)(local_68 + 0x10) +
                                (long)*(int *)(*(long *)(*(long *)(local_68 + 0x10) +
                                                        (lVar20 + -1) * 8) + 0xc) * 8),iVar16);
              iVar15 = *(int *)(pHVar17 + 4);
              pHVar24 = local_68;
            }
          } while( true );
        }
      }
LAB_009152e9:
      iVar16 = 1;
    }
    cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_a8);
    cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_88);
  }
  return iVar16;
LAB_009151e2:
  for (lVar20 = (long)*(int *)(pHVar17 + 4); lVar20 != 0; lVar20 = lVar20 + -1) {
    auVar35 = auVar34._8_56_;
    auVar32 = auVar30._8_56_;
    piVar1 = *(int **)(*(long *)(pHVar17 + 0x10) + -8 + lVar20 * 8);
    if (piVar1 != (int *)0x0) {
      if (-1 < piVar1[7]) break;
      cVar37 = TriNormal(verts + *piVar1,verts + piVar1[1],verts + piVar1[2]);
      auVar34._0_8_ = cVar37.m_floats._8_8_;
      auVar34._8_56_ = auVar35;
      auVar31._0_8_ = cVar37.m_floats._0_8_;
      auVar31._8_56_ = auVar32;
      local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar31._0_16_,auVar34._0_16_);
      auVar30 = ZEXT1664((undefined1  [16])local_60.m_floats);
      iVar16 = maxdirsterid<cbtVector3>(verts,verts_count,&local_60,&local_a8);
      piVar1[7] = iVar16;
      lVar19 = (long)iVar16;
      if (*(int *)((long)local_88.m_data + lVar19 * 4) == 0) {
        iVar16 = *piVar1;
        fVar7 = verts[lVar19].m_floats[0] - verts[iVar16].m_floats[0];
        auVar30 = ZEXT464((uint)fVar7);
        auVar2 = vfmadd231ss_fma(ZEXT416((uint)((verts[lVar19].m_floats[1] -
                                                verts[iVar16].m_floats[1]) * local_60.m_floats[1])),
                                 ZEXT416((uint)fVar7),ZEXT416((uint)local_60.m_floats[0]));
        auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)(verts[lVar19].m_floats[2] -
                                                      verts[iVar16].m_floats[2])),
                                 ZEXT416((uint)local_60.m_floats[2]));
        auVar34 = ZEXT1664(auVar2);
        piVar1[8] = auVar2._0_4_;
      }
      else {
        piVar1[7] = -1;
      }
    }
  }
  uVar26 = (ulong)((int)local_48 - 1);
  if ((int)local_48 < 2) goto LAB_009152e9;
  goto LAB_00914f84;
}

Assistant:

int HullLibrary::calchullgen(cbtVector3 *verts, int verts_count, int vlimit)
{
	if (verts_count < 4) return 0;
	if (vlimit == 0) vlimit = 1000000000;
	int j;
	cbtVector3 bmin(*verts), bmax(*verts);
	cbtAlignedObjectArray<int> isextreme;
	isextreme.reserve(verts_count);
	cbtAlignedObjectArray<int> allow;
	allow.reserve(verts_count);

	for (j = 0; j < verts_count; j++)
	{
		allow.push_back(1);
		isextreme.push_back(0);
		bmin.setMin(verts[j]);
		bmax.setMax(verts[j]);
	}
	cbtScalar epsilon = (bmax - bmin).length() * cbtScalar(0.001);
	cbtAssert(epsilon != 0.0);

	cbtInt4 p = FindSimplex(verts, verts_count, allow);
	if (p.x == -1) return 0;  // simplex failed

	cbtVector3 center = (verts[p[0]] + verts[p[1]] + verts[p[2]] + verts[p[3]]) / cbtScalar(4.0);  // a valid interior point
	cbtHullTriangle *t0 = allocateTriangle(p[2], p[3], p[1]);
    t0->n = cbtInt3(2, 3, 1);
	cbtHullTriangle *t1 = allocateTriangle(p[3], p[2], p[0]);
    t1->n = cbtInt3(3, 2, 0);
	cbtHullTriangle *t2 = allocateTriangle(p[0], p[1], p[3]);
    t2->n = cbtInt3(0, 1, 3);
	cbtHullTriangle *t3 = allocateTriangle(p[1], p[0], p[2]);
    t3->n = cbtInt3(1, 0, 2);
	isextreme[p[0]] = isextreme[p[1]] = isextreme[p[2]] = isextreme[p[3]] = 1;
	checkit(t0);
	checkit(t1);
	checkit(t2);
	checkit(t3);

	for (j = 0; j < m_tris.size(); j++)
	{
		cbtHullTriangle *t = m_tris[j];
		cbtAssert(t);
		cbtAssert(t->vmax < 0);
		cbtVector3 n = TriNormal(verts[(*t)[0]], verts[(*t)[1]], verts[(*t)[2]]);
		t->vmax = maxdirsterid(verts, verts_count, n, allow);
		t->rise = cbtDot(n, verts[t->vmax] - verts[(*t)[0]]);
	}
	cbtHullTriangle *te;
	vlimit -= 4;
	while (vlimit > 0 && ((te = extrudable(epsilon)) != 0))
	{
		//int3 ti=*te;
		int v = te->vmax;
		cbtAssert(v != -1);
		cbtAssert(!isextreme[v]);  // wtf we've already done this vertex
		isextreme[v] = 1;
		//if(v==p0 || v==p1 || v==p2 || v==p3) continue; // done these already
		j = m_tris.size();
		while (j--)
		{
			if (!m_tris[j]) continue;
            cbtInt3 t = *m_tris[j];
			if (above(verts, t, verts[v], cbtScalar(0.01) * epsilon))
			{
				extrude(m_tris[j], v);
			}
		}
		// now check for those degenerate cases where we have a flipped triangle or a really skinny triangle
		j = m_tris.size();
		while (j--)
		{
			if (!m_tris[j]) continue;
			if (!hasvert(*m_tris[j], v)) break;
            cbtInt3 nt = *m_tris[j];
			if (above(verts, nt, center, cbtScalar(0.01) * epsilon) || cbtCross(verts[nt[1]] - verts[nt[0]], verts[nt[2]] - verts[nt[1]]).length() < epsilon * epsilon * cbtScalar(0.1))
			{
				cbtHullTriangle *nb = m_tris[m_tris[j]->n[0]];
				cbtAssert(nb);
				cbtAssert(!hasvert(*nb, v));
				cbtAssert(nb->id < j);
				extrude(nb, v);
				j = m_tris.size();
			}
		}
		j = m_tris.size();
		while (j--)
		{
			cbtHullTriangle *t = m_tris[j];
			if (!t) continue;
			if (t->vmax >= 0) break;
			cbtVector3 n = TriNormal(verts[(*t)[0]], verts[(*t)[1]], verts[(*t)[2]]);
			t->vmax = maxdirsterid(verts, verts_count, n, allow);
			if (isextreme[t->vmax])
			{
				t->vmax = -1;  // already done that vertex - algorithm needs to be able to terminate.
			}
			else
			{
				t->rise = cbtDot(n, verts[t->vmax] - verts[(*t)[0]]);
			}
		}
		vlimit--;
	}
	return 1;
}